

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void fchmod_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  int iVar2;
  __uid_t _Var3;
  uv_loop_t *puVar4;
  uv_loop_t *loop;
  void *pvVar5;
  uv_file file;
  uv_fs_t *unaff_RBX;
  uv_loop_t *puVar6;
  char *loop_00;
  uv_fs_t *unaff_R14;
  uv_fs_t *puVar7;
  uv_fs_t *puVar8;
  uv_fs_t *puVar9;
  uv_fs_t *puVar10;
  uv_buf_t uVar11;
  uv_fs_t uStackY_768;
  uv_loop_t *puStackY_5b0;
  code *pcStackY_5a8;
  undefined1 auStack_590 [576];
  uv_loop_t *puStack_350;
  uv_loop_t *puStack_1f0;
  uv_fs_t *puStack_1e8;
  uv_loop_t *puStack_178;
  uv_fs_t *puStack_18;
  
  if (req->fs_type == UV_FS_FCHMOD) {
    unaff_RBX = req;
    if (req->result == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      uv_fs_req_cleanup(req);
      check_permission("test_file",*req->data);
      return;
    }
  }
  else {
    fchmod_cb_cold_1();
  }
  fchmod_cb_cold_2();
  puVar6 = (uv_loop_t *)0x194385;
  puStack_1e8 = (uv_fs_t *)0x152bd1;
  puStack_18 = unaff_RBX;
  unlink("test_file");
  puStack_1e8 = (uv_fs_t *)0x152bd6;
  ::loop = uv_default_loop();
  puStack_1e8 = (uv_fs_t *)0x152bfa;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,"test_file",0x42,0x180,
                     (uv_fs_cb)0x0);
  puVar4 = puStack_178;
  if (iVar2 < 0) {
    puStack_1e8 = (uv_fs_t *)0x152d97;
    run_test_fs_unlink_readonly_cold_1();
LAB_00152d97:
    puStack_1e8 = (uv_fs_t *)0x152d9c;
    run_test_fs_unlink_readonly_cold_2();
LAB_00152d9c:
    puStack_1e8 = (uv_fs_t *)0x152da1;
    run_test_fs_unlink_readonly_cold_3();
LAB_00152da1:
    puStack_1e8 = (uv_fs_t *)0x152da6;
    run_test_fs_unlink_readonly_cold_4();
LAB_00152da6:
    puStack_1e8 = (uv_fs_t *)0x152dab;
    run_test_fs_unlink_readonly_cold_5();
LAB_00152dab:
    puStack_1e8 = (uv_fs_t *)0x152db0;
    run_test_fs_unlink_readonly_cold_6();
LAB_00152db0:
    puStack_1e8 = (uv_fs_t *)0x152db5;
    run_test_fs_unlink_readonly_cold_7();
LAB_00152db5:
    puStack_1e8 = (uv_fs_t *)0x152dba;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    puVar6 = puStack_178;
    if ((long)puStack_178 < 0) goto LAB_00152d97;
    unaff_R14 = (uv_fs_t *)&stack0xfffffffffffffe30;
    puStack_1e8 = (uv_fs_t *)0x152c1d;
    uv_fs_req_cleanup(unaff_R14);
    puStack_1e8 = (uv_fs_t *)0x152c2e;
    iov = uv_buf_init(test_buf,0xd);
    puStack_1e8 = (uv_fs_t *)0x152c64;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,unaff_R14,(uv_file)puVar4,&iov,1,-1,(uv_fs_cb)0x0);
    puVar6 = puVar4;
    if (iVar2 != 0xd) goto LAB_00152d9c;
    if (puStack_178 != (uv_loop_t *)0xd) goto LAB_00152da1;
    unaff_R14 = (uv_fs_t *)&stack0xfffffffffffffe30;
    puStack_1e8 = (uv_fs_t *)0x152c86;
    uv_fs_req_cleanup(unaff_R14);
    puStack_1e8 = (uv_fs_t *)0x152c99;
    uv_fs_close(::loop,unaff_R14,(uv_file)puVar4,(uv_fs_cb)0x0);
    puStack_1e8 = (uv_fs_t *)0x152cb2;
    iVar2 = uv_fs_chmod((uv_loop_t *)0x0,unaff_R14,"test_file",0x100,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00152da6;
    if (puStack_178 != (uv_loop_t *)0x0) goto LAB_00152dab;
    puVar6 = (uv_loop_t *)&stack0xfffffffffffffe30;
    puStack_1e8 = (uv_fs_t *)0x152cd3;
    uv_fs_req_cleanup((uv_fs_t *)puVar6);
    unaff_R14 = (uv_fs_t *)0x194385;
    puStack_1e8 = (uv_fs_t *)0x152ce7;
    check_permission("test_file",0x100);
    puStack_1e8 = (uv_fs_t *)0x152cf6;
    iVar2 = uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)puVar6,"test_file",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00152db0;
    if (puStack_178 != (uv_loop_t *)0x0) goto LAB_00152db5;
    puStack_1e8 = (uv_fs_t *)0x152d17;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe30);
    puStack_1e8 = (uv_fs_t *)0x152d25;
    uv_run(::loop,UV_RUN_DEFAULT);
    unaff_R14 = (uv_fs_t *)0x194385;
    puStack_1e8 = (uv_fs_t *)0x152d41;
    uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,"test_file",0x180,(uv_fs_cb)0x0
               );
    puStack_1e8 = (uv_fs_t *)0x152d49;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe30);
    puStack_1e8 = (uv_fs_t *)0x152d51;
    unlink("test_file");
    puStack_1e8 = (uv_fs_t *)0x152d56;
    puVar6 = uv_default_loop();
    puStack_1e8 = (uv_fs_t *)0x152d6a;
    uv_walk(puVar6,close_walk_cb,(void *)0x0);
    puStack_1e8 = (uv_fs_t *)0x152d74;
    uv_run(puVar6,UV_RUN_DEFAULT);
    puStack_1e8 = (uv_fs_t *)0x152d79;
    puVar4 = uv_default_loop();
    puStack_1e8 = (uv_fs_t *)0x152d81;
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return;
    }
  }
  puStack_1e8 = (uv_fs_t *)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  puVar7 = (uv_fs_t *)(auStack_590 + 0x1e8);
  puVar8 = (uv_fs_t *)(auStack_590 + 0x1e8);
  puVar9 = (uv_fs_t *)(auStack_590 + 0x1e8);
  puVar10 = (uv_fs_t *)(auStack_590 + 0x1e8);
  puVar4 = (uv_loop_t *)0x194385;
  auStack_590._480_8_ = (void *)0x152dd8;
  puStack_1f0 = puVar6;
  puStack_1e8 = unaff_R14;
  unlink("test_file");
  auStack_590._480_8_ = (void *)0x152de4;
  unlink("test_file_link");
  auStack_590._480_8_ = (void *)0x152de9;
  ::loop = uv_default_loop();
  loop = (uv_loop_t *)0x0;
  auStack_590._480_8_ = (void *)0x152e0b;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_590 + 0x1e8),"test_file",0x42,0x180,
                     (uv_fs_cb)0x0);
  puVar6 = puStack_350;
  if (iVar2 < 0) {
    auStack_590._480_8_ = (void *)0x1530dc;
    run_test_fs_chown_cold_1();
LAB_001530dc:
    auStack_590._480_8_ = (void *)0x1530e1;
    run_test_fs_chown_cold_2();
LAB_001530e1:
    auStack_590._480_8_ = (void *)0x1530e6;
    run_test_fs_chown_cold_3();
LAB_001530e6:
    puVar7 = unaff_R14;
    auStack_590._480_8_ = (void *)0x1530eb;
    run_test_fs_chown_cold_4();
LAB_001530eb:
    auStack_590._480_8_ = (void *)0x1530f0;
    run_test_fs_chown_cold_5();
LAB_001530f0:
    puVar8 = puVar7;
    auStack_590._480_8_ = (void *)0x1530f5;
    run_test_fs_chown_cold_6();
LAB_001530f5:
    auStack_590._480_8_ = (void *)0x1530fa;
    run_test_fs_chown_cold_7();
LAB_001530fa:
    auStack_590._480_8_ = (void *)0x1530ff;
    run_test_fs_chown_cold_8();
LAB_001530ff:
    auStack_590._480_8_ = (void *)0x153104;
    run_test_fs_chown_cold_9();
LAB_00153104:
    auStack_590._480_8_ = (void *)0x153109;
    run_test_fs_chown_cold_10();
LAB_00153109:
    auStack_590._480_8_ = (void *)0x15310e;
    run_test_fs_chown_cold_11();
LAB_0015310e:
    auStack_590._480_8_ = (void *)0x153113;
    run_test_fs_chown_cold_12();
LAB_00153113:
    auStack_590._480_8_ = (void *)0x153118;
    run_test_fs_chown_cold_13();
LAB_00153118:
    puVar9 = puVar8;
    auStack_590._480_8_ = (void *)0x15311d;
    run_test_fs_chown_cold_14();
LAB_0015311d:
    auStack_590._480_8_ = (void *)0x153122;
    run_test_fs_chown_cold_15();
LAB_00153122:
    puVar10 = puVar9;
    auStack_590._480_8_ = (void *)0x153127;
    run_test_fs_chown_cold_16();
LAB_00153127:
    auStack_590._480_8_ = (void *)0x15312c;
    run_test_fs_chown_cold_17();
LAB_0015312c:
    auStack_590._480_8_ = (void *)0x153131;
    run_test_fs_chown_cold_18();
LAB_00153131:
    auStack_590._480_8_ = (void *)0x153136;
    run_test_fs_chown_cold_19();
LAB_00153136:
    auStack_590._480_8_ = (void *)0x15313b;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar4 = puStack_350;
    if ((long)puStack_350 < 0) goto LAB_001530dc;
    auStack_590._480_8_ = (void *)0x152e2c;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_590 + 0x1e8));
    loop = (uv_loop_t *)0x0;
    auStack_590._480_8_ = (void *)0x152e4b;
    iVar2 = uv_fs_chown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_590 + 0x1e8),"test_file",0xffffffff,
                        0xffffffff,(uv_fs_cb)0x0);
    puVar4 = puVar6;
    unaff_R14 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (iVar2 != 0) goto LAB_001530e1;
    unaff_R14 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (puStack_350 != (uv_loop_t *)0x0) goto LAB_001530e6;
    auStack_590._480_8_ = (void *)0x152e6a;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_590 + 0x1e8));
    loop = (uv_loop_t *)0x0;
    file = (uv_file)puVar6;
    auStack_590._480_8_ = (void *)0x152e84;
    iVar2 = uv_fs_fchown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_590 + 0x1e8),file,0xffffffff,
                         0xffffffff,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001530eb;
    puVar7 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (puStack_350 != (uv_loop_t *)0x0) goto LAB_001530f0;
    auStack_590._480_8_ = (void *)0x152ea3;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_590 + 0x1e8));
    auStack_590._480_8_ = (void *)0x152ecb;
    loop = ::loop;
    iVar2 = uv_fs_chown(::loop,(uv_fs_t *)(auStack_590 + 0x1e8),"test_file",0xffffffff,0xffffffff,
                        chown_cb);
    if (iVar2 != 0) goto LAB_001530f5;
    auStack_590._480_8_ = (void *)0x152ee1;
    loop = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    puVar8 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (chown_cb_count != 1) goto LAB_001530fa;
    chown_cb_count = 0;
    auStack_590._480_8_ = (void *)0x152f1a;
    loop = ::loop;
    iVar2 = uv_fs_chown(::loop,(uv_fs_t *)(auStack_590 + 0x1e8),"test_file",0,0,chown_root_cb);
    puVar8 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (iVar2 != 0) goto LAB_001530ff;
    auStack_590._480_8_ = (void *)0x152f30;
    loop = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    puVar8 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (chown_cb_count != 1) goto LAB_00153104;
    auStack_590._480_8_ = (void *)0x152f60;
    loop = ::loop;
    iVar2 = uv_fs_fchown(::loop,(uv_fs_t *)(auStack_590 + 0x1e8),file,0xffffffff,0xffffffff,
                         fchown_cb);
    puVar8 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (iVar2 != 0) goto LAB_00153109;
    auStack_590._480_8_ = (void *)0x152f76;
    loop = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    puVar8 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (fchown_cb_count != 1) goto LAB_0015310e;
    loop = (uv_loop_t *)0x0;
    auStack_590._480_8_ = (void *)0x152f9e;
    iVar2 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)(auStack_590 + 0x1e8),"test_file",
                       "test_file_link",(uv_fs_cb)0x0);
    puVar8 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (iVar2 != 0) goto LAB_00153113;
    puVar8 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (puStack_350 != (uv_loop_t *)0x0) goto LAB_00153118;
    auStack_590._480_8_ = (void *)0x152fbd;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_590 + 0x1e8));
    loop = (uv_loop_t *)0x0;
    auStack_590._480_8_ = (void *)0x152fdc;
    iVar2 = uv_fs_lchown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_590 + 0x1e8),"test_file_link",
                         0xffffffff,0xffffffff,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015311d;
    puVar9 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (puStack_350 != (uv_loop_t *)0x0) goto LAB_00153122;
    auStack_590._480_8_ = (void *)0x152ffb;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_590 + 0x1e8));
    auStack_590._480_8_ = (void *)0x153023;
    loop = ::loop;
    iVar2 = uv_fs_lchown(::loop,(uv_fs_t *)(auStack_590 + 0x1e8),"test_file_link",0xffffffff,
                         0xffffffff,lchown_cb);
    if (iVar2 != 0) goto LAB_00153127;
    auStack_590._480_8_ = (void *)0x153039;
    loop = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    puVar10 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (lchown_cb_count != 1) goto LAB_0015312c;
    loop = (uv_loop_t *)0x0;
    auStack_590._480_8_ = (void *)0x153054;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)(auStack_590 + 0x1e8),file,(uv_fs_cb)0x0);
    puVar10 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (iVar2 != 0) goto LAB_00153131;
    puVar10 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (puStack_350 != (uv_loop_t *)0x0) goto LAB_00153136;
    auStack_590._480_8_ = (void *)0x153070;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_590 + 0x1e8));
    auStack_590._480_8_ = (void *)0x15307e;
    uv_run(::loop,UV_RUN_DEFAULT);
    auStack_590._480_8_ = (void *)0x15308a;
    unlink("test_file");
    auStack_590._480_8_ = (void *)0x153096;
    unlink("test_file_link");
    auStack_590._480_8_ = (void *)0x15309b;
    puVar4 = uv_default_loop();
    auStack_590._480_8_ = (void *)0x1530af;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    auStack_590._480_8_ = (void *)0x1530b9;
    uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_590._480_8_ = (void *)0x1530be;
    loop = uv_default_loop();
    auStack_590._480_8_ = (void *)0x1530c6;
    iVar2 = uv_loop_close(loop);
    puVar10 = (uv_fs_t *)(auStack_590 + 0x1e8);
    if (iVar2 == 0) {
      return;
    }
  }
  auStack_590._480_8_ = chown_cb;
  run_test_fs_chown_cold_21();
  if (loop->backend_fd == 0x1a) {
    if (loop->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)loop);
      return;
    }
  }
  else {
    auStack_590._472_8_ = (void *)0x15315f;
    chown_cb_cold_1();
  }
  auStack_590._472_8_ = chown_root_cb;
  chown_cb_cold_2();
  auStack_590._472_8_ = puVar4;
  if (loop->backend_fd == 0x1a) {
    auStack_590._464_8_ = (void *)0x153173;
    puVar6 = loop;
    _Var3 = geteuid();
    pvVar5 = loop->watcher_queue[0];
    if (_Var3 != 0) {
      if (pvVar5 == (void *)0xffffffffffffffff) goto LAB_0015318b;
      auStack_590._464_8_ = (void *)0x153186;
      chown_root_cb_cold_2();
    }
    puVar4 = loop;
    if (pvVar5 == (void *)0x0) {
LAB_0015318b:
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)loop);
      return;
    }
  }
  else {
    auStack_590._464_8_ = (void *)0x15319f;
    chown_root_cb_cold_1();
    puVar6 = loop;
  }
  auStack_590._464_8_ = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar6->backend_fd == 0x1b) {
    if (puVar6->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar6);
      return;
    }
  }
  else {
    auStack_590._456_8_ = (uv__io_cb)0x1531c3;
    fchown_cb_cold_1();
  }
  auStack_590._456_8_ = lchown_cb;
  fchown_cb_cold_2();
  if (puVar6->backend_fd == 0x1e) {
    if (puVar6->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar6);
      return;
    }
  }
  else {
    auStack_590._448_8_ = (_func_void *)0x1531e7;
    lchown_cb_cold_1();
  }
  auStack_590._448_8_ = run_test_fs_link;
  lchown_cb_cold_2();
  puVar6 = (uv_loop_t *)0x194385;
  pcStackY_5a8 = (code *)0x153205;
  auStack_590._440_8_ = puVar4;
  auStack_590._448_8_ = puVar10;
  unlink("test_file");
  pcStackY_5a8 = (code *)0x153211;
  unlink("test_file_link");
  pcStackY_5a8 = (code *)0x15321d;
  unlink("test_file_link2");
  pcStackY_5a8 = (code *)0x153222;
  ::loop = uv_default_loop();
  loop_00 = (char *)0x0;
  pcStackY_5a8 = (code *)0x153246;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_590,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar1 = auStack_590._88_8_;
  if (iVar2 < 0) {
    pcStackY_5a8 = (code *)0x153584;
    run_test_fs_link_cold_1();
LAB_00153584:
    pcStackY_5a8 = (code *)0x153589;
    run_test_fs_link_cold_2();
LAB_00153589:
    pcStackY_5a8 = (code *)0x15358e;
    run_test_fs_link_cold_3();
LAB_0015358e:
    pcStackY_5a8 = (code *)0x153593;
    run_test_fs_link_cold_4();
LAB_00153593:
    pcStackY_5a8 = (code *)0x153598;
    run_test_fs_link_cold_5();
LAB_00153598:
    pcStackY_5a8 = (code *)0x15359d;
    run_test_fs_link_cold_6();
LAB_0015359d:
    puVar4 = puVar6;
    pcStackY_5a8 = (code *)0x1535a2;
    run_test_fs_link_cold_7();
LAB_001535a2:
    pcStackY_5a8 = (code *)0x1535a7;
    run_test_fs_link_cold_8();
LAB_001535a7:
    pcStackY_5a8 = (code *)0x1535ac;
    run_test_fs_link_cold_9();
LAB_001535ac:
    pcStackY_5a8 = (code *)0x1535b1;
    run_test_fs_link_cold_10();
LAB_001535b1:
    pcStackY_5a8 = (code *)0x1535b6;
    run_test_fs_link_cold_11();
LAB_001535b6:
    pcStackY_5a8 = (code *)0x1535bb;
    run_test_fs_link_cold_12();
LAB_001535bb:
    pcStackY_5a8 = (code *)0x1535c0;
    run_test_fs_link_cold_13();
LAB_001535c0:
    puVar6 = puVar4;
    pcStackY_5a8 = (code *)0x1535c5;
    run_test_fs_link_cold_14();
LAB_001535c5:
    pcStackY_5a8 = (code *)0x1535ca;
    run_test_fs_link_cold_15();
LAB_001535ca:
    pcStackY_5a8 = (code *)0x1535cf;
    run_test_fs_link_cold_16();
LAB_001535cf:
    pcStackY_5a8 = (code *)0x1535d4;
    run_test_fs_link_cold_17();
LAB_001535d4:
    pcStackY_5a8 = (code *)0x1535d9;
    run_test_fs_link_cold_18();
  }
  else {
    puVar6 = (uv_loop_t *)auStack_590._88_8_;
    if ((long)auStack_590._88_8_ < 0) goto LAB_00153584;
    pcStackY_5a8 = (code *)0x153269;
    uv_fs_req_cleanup((uv_fs_t *)auStack_590);
    pcStackY_5a8 = (code *)0x15327a;
    uVar11 = uv_buf_init(test_buf,0xd);
    loop_00 = (char *)0x0;
    pcStackY_5a8 = (code *)0x1532b0;
    iov = uVar11;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)auStack_590,(uv_file)uVar1,&iov,1,-1,
                        (uv_fs_cb)0x0);
    puVar6 = (uv_loop_t *)uVar1;
    if (iVar2 != 0xd) goto LAB_00153589;
    if ((uv_loop_t *)auStack_590._88_8_ != (uv_loop_t *)0xd) goto LAB_0015358e;
    pcStackY_5a8 = (code *)0x1532d2;
    uv_fs_req_cleanup((uv_fs_t *)auStack_590);
    pcStackY_5a8 = (code *)0x1532e5;
    uv_fs_close(::loop,(uv_fs_t *)auStack_590,(uv_file)uVar1,(uv_fs_cb)0x0);
    loop_00 = (char *)0x0;
    pcStackY_5a8 = (code *)0x153300;
    iVar2 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)auStack_590,"test_file","test_file_link",
                       (uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00153593;
    if ((uv_loop_t *)auStack_590._88_8_ != (uv_loop_t *)0x0) goto LAB_00153598;
    pcStackY_5a8 = (code *)0x153321;
    uv_fs_req_cleanup((uv_fs_t *)auStack_590);
    loop_00 = (char *)0x0;
    pcStackY_5a8 = (code *)0x15333d;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_590,"test_file_link",2,0,(uv_fs_cb)0x0);
    puVar4 = (uv_loop_t *)auStack_590._88_8_;
    puVar6 = (uv_loop_t *)auStack_590;
    if (iVar2 < 0) goto LAB_0015359d;
    if ((long)auStack_590._88_8_ < 0) goto LAB_001535a2;
    pcStackY_5a8 = (code *)0x153360;
    uv_fs_req_cleanup((uv_fs_t *)auStack_590);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_5a8 = (code *)0x153382;
    uVar11 = uv_buf_init(buf,0x20);
    loop_00 = (char *)0x0;
    pcStackY_5a8 = (code *)0x1533b4;
    iov = uVar11;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)auStack_590,(uv_file)puVar4,&iov,1,0,
                       (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001535a7;
    if ((long)auStack_590._88_8_ < 0) goto LAB_001535ac;
    loop_00 = buf;
    pcStackY_5a8 = (code *)0x1533db;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_001535b1;
    pcStackY_5a8 = (code *)0x1533ea;
    close((uv_file)puVar4);
    pcStackY_5a8 = (code *)0x153410;
    loop_00 = (char *)::loop;
    iVar2 = uv_fs_link(::loop,(uv_fs_t *)auStack_590,"test_file","test_file_link2",link_cb);
    if (iVar2 != 0) goto LAB_001535b6;
    pcStackY_5a8 = (code *)0x153426;
    loop_00 = (char *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (link_cb_count != 1) goto LAB_001535bb;
    loop_00 = (char *)0x0;
    pcStackY_5a8 = (code *)0x153451;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_590,"test_file_link2",2,0,(uv_fs_cb)0x0);
    puVar6 = (uv_loop_t *)auStack_590._88_8_;
    if (iVar2 < 0) goto LAB_001535c0;
    if ((long)auStack_590._88_8_ < 0) goto LAB_001535c5;
    pcStackY_5a8 = (code *)0x153474;
    uv_fs_req_cleanup((uv_fs_t *)auStack_590);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_5a8 = (code *)0x153496;
    uVar11 = uv_buf_init(buf,0x20);
    loop_00 = (char *)0x0;
    pcStackY_5a8 = (code *)0x1534c8;
    iov = uVar11;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)auStack_590,(uv_file)puVar6,&iov,1,0,
                       (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001535ca;
    if ((long)auStack_590._88_8_ < 0) goto LAB_001535cf;
    loop_00 = buf;
    pcStackY_5a8 = (code *)0x1534ef;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_001535d4;
    pcStackY_5a8 = (code *)0x15350c;
    uv_fs_close(::loop,(uv_fs_t *)auStack_590,(uv_file)puVar6,(uv_fs_cb)0x0);
    pcStackY_5a8 = (code *)0x15351a;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_5a8 = (code *)0x153526;
    unlink("test_file");
    pcStackY_5a8 = (code *)0x153532;
    unlink("test_file_link");
    pcStackY_5a8 = (code *)0x15353e;
    unlink("test_file_link2");
    pcStackY_5a8 = (code *)0x153543;
    puVar6 = uv_default_loop();
    pcStackY_5a8 = (code *)0x153557;
    uv_walk(puVar6,close_walk_cb,(void *)0x0);
    pcStackY_5a8 = (code *)0x153561;
    uv_run(puVar6,UV_RUN_DEFAULT);
    pcStackY_5a8 = (code *)0x153566;
    loop_00 = (char *)uv_default_loop();
    pcStackY_5a8 = (code *)0x15356e;
    iVar2 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar2 == 0) {
      return;
    }
  }
  pcStackY_5a8 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)loop_00)->backend_fd == 0x17) {
    if (((uv_loop_t *)loop_00)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)loop_00);
      return;
    }
  }
  else {
    puStackY_5b0 = (uv_loop_t *)0x1535fd;
    link_cb_cold_1();
  }
  puStackY_5b0 = (uv_loop_t *)run_test_fs_readlink;
  link_cb_cold_2();
  puStackY_5b0 = puVar6;
  ::loop = uv_default_loop();
  iVar2 = uv_fs_readlink(::loop,&uStackY_768,"no_such_file",dummy_cb);
  if (iVar2 == 0) {
    iVar2 = uv_run(::loop,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_001536f7;
    if (dummy_cb_count != 1) goto LAB_001536fc;
    if (uStackY_768.ptr != (void *)0x0) goto LAB_00153701;
    if (uStackY_768.result != -2) goto LAB_00153706;
    uv_fs_req_cleanup(&uStackY_768);
    iVar2 = uv_fs_readlink((uv_loop_t *)0x0,&uStackY_768,"no_such_file",(uv_fs_cb)0x0);
    if (iVar2 != -2) goto LAB_0015370b;
    if (uStackY_768.ptr != (void *)0x0) goto LAB_00153710;
    if (uStackY_768.result == -2) {
      uv_fs_req_cleanup(&uStackY_768);
      puVar6 = uv_default_loop();
      uv_walk(puVar6,close_walk_cb,(void *)0x0);
      uv_run(puVar6,UV_RUN_DEFAULT);
      puVar6 = uv_default_loop();
      iVar2 = uv_loop_close(puVar6);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_0015371a;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_001536f7:
    run_test_fs_readlink_cold_2();
LAB_001536fc:
    run_test_fs_readlink_cold_3();
LAB_00153701:
    run_test_fs_readlink_cold_4();
LAB_00153706:
    run_test_fs_readlink_cold_5();
LAB_0015370b:
    run_test_fs_readlink_cold_6();
LAB_00153710:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_0015371a:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return;
}

Assistant:

static void fchmod_cb(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_FCHMOD);
  ASSERT(req->result == 0);
  fchmod_cb_count++;
  uv_fs_req_cleanup(req);
  check_permission("test_file", *(int*)req->data);
}